

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

FSerializer * __thiscall
FSerializer::Sprite(FSerializer *this,char *key,int32_t *spritenum,int32_t *def)

{
  uint uVar1;
  FWriter *pFVar2;
  Value *this_00;
  Ch *cc;
  DWORD *pDVar3;
  ulong uVar4;
  spritedef_t *psVar5;
  
  pFVar2 = this->w;
  if (pFVar2 == (FWriter *)0x0) {
    this_00 = FReader::FindKey(this->r,key);
    if ((this_00 != (Value *)0x0) && ((*(byte *)((long)&this_00->data_ + 0x17) & 4) != 0)) {
      cc = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
      pDVar3 = (DWORD *)UnicodeToString(cc);
      psVar5 = sprites.Array + NumStdSprites;
      uVar4 = 0;
      do {
        psVar5 = psVar5 + -1;
        if (NumStdSprites == uVar4) {
          return this;
        }
        uVar4 = uVar4 + 1;
      } while ((psVar5->field_0).dwName != *pDVar3);
      *spritenum = NumStdSprites - (int)uVar4;
    }
  }
  else {
    uVar1 = (pFVar2->mInObject).Count;
    if ((((uVar1 == 0) || (def == (int32_t *)0x0)) ||
        ((pFVar2->mInObject).Array[uVar1 - 1] == false)) || (*def != *spritenum)) {
      WriteKey(this,key);
      FWriter::String(this->w,(char *)(sprites.Array + *spritenum),4);
    }
  }
  return this;
}

Assistant:

FSerializer &FSerializer::Sprite(const char *key, int32_t &spritenum, int32_t *def)
{
	if (isWriting())
	{
		if (w->inObject() && def != nullptr && *def == spritenum) return *this;
		WriteKey(key);
		w->String(sprites[spritenum].name, 4);
	}
	else
	{
		auto val = r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsString())
			{
				uint32_t name = *reinterpret_cast<const uint32_t*>(UnicodeToString(val->GetString()));
				for (auto hint = NumStdSprites; hint-- != 0; )
				{
					if (sprites[hint].dwName == name)
					{
						spritenum = hint;
						break;
					}
				}
			}
		}
	}
	return *this;
}